

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O0

int write_webm_file_header
              (WebmOutputContext *webm_ctx,aom_codec_ctx_t *encoder_ctx,aom_codec_enc_cfg_t *cfg,
              stereo_format_t stereo_fmt,uint fourcc,AvxRational *par,char *encoder_settings)

{
  bool bVar1;
  undefined1 uVar2;
  void *pvVar3;
  pointer pSVar4;
  uint64_t uVar5;
  VideoTrack *config;
  Track *this;
  ulong uVar6;
  pointer pMVar7;
  byte in_CL;
  long in_RDX;
  int *in_RDI;
  int in_R8D;
  int *in_R9;
  double dVar8;
  long in_stack_00000008;
  Tag *tag;
  uint64_t display_width;
  size_t bytes_written;
  uint8_t av1_config_buffer [4];
  Av1Config av1_config;
  aom_fixed_buf_t *obu_sequence_header;
  VideoTrack *video_track;
  uint64_t video_track_id;
  string version;
  uint64_t kTimecodeScale;
  SegmentInfo *info;
  bool ok;
  unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> segment;
  unique_ptr<mkvmuxer::MkvWriter,_std::default_delete<mkvmuxer::MkvWriter>_> writer;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  Segment *in_stack_fffffffffffffe40;
  undefined6 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  int in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  SegmentInfo *in_stack_fffffffffffffe60;
  int is_annexb;
  SegmentInfo *length;
  uint8_t *in_stack_fffffffffffffe78;
  Segment *in_stack_fffffffffffffe80;
  Segment *this_00;
  size_t local_128;
  uint8_t local_11c [7];
  Av1Config local_115;
  Track *local_108;
  VideoTrack *local_100;
  uint64_t local_f8;
  undefined1 local_e9 [33];
  string local_c8 [39];
  undefined1 local_a1 [33];
  undefined8 local_80;
  SegmentInfo *local_78;
  byte local_69;
  undefined4 local_68;
  undefined1 local_61;
  void *local_60;
  undefined1 local_39;
  int *local_30;
  int local_28;
  byte local_21;
  long local_20;
  int *local_10;
  int local_4;
  
  local_30 = in_R9;
  local_28 = in_R8D;
  local_21 = in_CL;
  local_20 = in_RDX;
  local_10 = in_RDI;
  pvVar3 = operator_new(0x18,(nothrow_t *)&std::nothrow);
  local_39 = 0;
  if (pvVar3 != (void *)0x0) {
    local_39 = 1;
    mkvmuxer::MkvWriter::MkvWriter
              ((MkvWriter *)in_stack_fffffffffffffe40,
               (FILE *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  }
  std::unique_ptr<mkvmuxer::MkvWriter,std::default_delete<mkvmuxer::MkvWriter>>::
  unique_ptr<std::default_delete<mkvmuxer::MkvWriter>,void>
            ((unique_ptr<mkvmuxer::MkvWriter,_std::default_delete<mkvmuxer::MkvWriter>_> *)
             in_stack_fffffffffffffe40,
             (pointer)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  pvVar3 = operator_new(0x990,(nothrow_t *)&std::nothrow);
  local_61 = 0;
  if (pvVar3 != (void *)0x0) {
    local_61 = 1;
    local_60 = pvVar3;
    mkvmuxer::Segment::Segment(in_stack_fffffffffffffe80);
  }
  std::unique_ptr<mkvmuxer::Segment,std::default_delete<mkvmuxer::Segment>>::
  unique_ptr<std::default_delete<mkvmuxer::Segment>,void>
            ((unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> *)
             in_stack_fffffffffffffe40,
             (pointer)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  bVar1 = std::operator==((unique_ptr<mkvmuxer::MkvWriter,_std::default_delete<mkvmuxer::MkvWriter>_>
                           *)in_stack_fffffffffffffe40,
                          (nullptr_t)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  if ((bVar1) ||
     (bVar1 = std::operator==((unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>
                               *)in_stack_fffffffffffffe40,
                              (nullptr_t)
                              CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38)), bVar1)
     ) {
    fprintf(_stderr,"webmenc> mkvmuxer objects alloc failed, out of memory?\n");
    local_4 = -1;
    local_68 = 1;
    goto LAB_00133907;
  }
  std::unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>::operator->
            ((unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> *)0x133147);
  std::unique_ptr<mkvmuxer::MkvWriter,_std::default_delete<mkvmuxer::MkvWriter>_>::get
            ((unique_ptr<mkvmuxer::MkvWriter,_std::default_delete<mkvmuxer::MkvWriter>_> *)
             in_stack_fffffffffffffe40);
  local_69 = mkvmuxer::Segment::Init
                       ((Segment *)
                        CONCAT17(in_stack_fffffffffffffe4f,
                                 CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)),
                        (IMkvWriter *)in_stack_fffffffffffffe40);
  if (!(bool)local_69) {
    fprintf(_stderr,"webmenc> mkvmuxer Init failed.\n");
    local_4 = -1;
    local_68 = 1;
    goto LAB_00133907;
  }
  pSVar4 = std::unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>::operator->
                     ((unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> *)
                      0x1331dc);
  mkvmuxer::Segment::set_mode(pSVar4,kFile);
  pSVar4 = std::unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>::operator->
                     ((unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> *)
                      0x1331f8);
  mkvmuxer::Segment::OutputCues(pSVar4,true);
  pSVar4 = std::unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>::operator->
                     ((unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> *)
                      0x133214);
  local_78 = mkvmuxer::Segment::GetSegmentInfo(pSVar4);
  if (local_78 == (SegmentInfo *)0x0) {
    fprintf(_stderr,"webmenc> Cannot retrieve Segment Info.\n");
    local_4 = -1;
    local_68 = 1;
    goto LAB_00133907;
  }
  local_80 = 1000000;
  mkvmuxer::SegmentInfo::set_timecode_scale(local_78,1000000);
  this_00 = (Segment *)local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a1 + 1),"aomenc",(allocator *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_a1);
  if (*local_10 == 0) {
    in_stack_fffffffffffffe80 = (Segment *)local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_e9 + 1)," ",(allocator *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffe78 = (uint8_t *)aom_codec_version_str();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe4f,
                            CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)),
                   (char *)in_stack_fffffffffffffe40);
    std::__cxx11::string::append((string *)(local_a1 + 1));
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string((string *)(local_e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e9);
  }
  length = local_78;
  std::__cxx11::string::c_str();
  mkvmuxer::SegmentInfo::set_writing_app(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>::operator->
            ((unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> *)0x133439);
  uVar5 = mkvmuxer::Segment::AddVideoTrack
                    (this_00,(int32_t)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                     (int32_t)in_stack_fffffffffffffe80,
                     (int32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  local_f8 = uVar5;
  std::unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>::operator->
            ((unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> *)0x133475);
  is_annexb = (int)(uVar5 >> 0x20);
  config = (VideoTrack *)
           mkvmuxer::Segment::GetTrackByNumber
                     (in_stack_fffffffffffffe40,
                      CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  local_100 = config;
  if (config == (VideoTrack *)0x0) {
    fprintf(_stderr,"webmenc> Video track creation failed.\n");
    local_4 = -1;
  }
  else {
    local_69 = 0;
    this = (Track *)aom_codec_get_global_headers((aom_codec_ctx_t *)in_stack_fffffffffffffe40);
    local_108 = this;
    if (this != (Track *)0x0) {
      in_stack_fffffffffffffe54 =
           get_av1config_from_obu
                     (in_stack_fffffffffffffe78,(size_t)length,is_annexb,(Av1Config *)config);
      if (in_stack_fffffffffffffe54 == 0) {
        local_11c[0] = '\0';
        local_11c[1] = '\0';
        local_11c[2] = '\0';
        local_11c[3] = '\0';
        local_128 = 0;
        in_stack_fffffffffffffe50 = write_av1config(&local_115,4,&local_128,local_11c);
        if (in_stack_fffffffffffffe50 == 0) {
          in_stack_fffffffffffffe4f =
               mkvmuxer::Track::SetCodecPrivate
                         (this,(uint8_t *)((ulong)in_stack_fffffffffffffe54 << 0x20),
                          CONCAT17(in_stack_fffffffffffffe4f,
                                   CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)));
          local_69 = in_stack_fffffffffffffe4f;
        }
      }
      free(local_108->_vptr_Track);
      free(local_108);
    }
    if ((local_69 & 1) == 0) {
      fprintf(_stderr,"webmenc> Unable to set AV1 config.\n");
      local_4 = -1;
    }
    else {
      uVar2 = mkvmuxer::VideoTrack::SetStereoMode(local_100,(ulong)local_21);
      local_69 = uVar2;
      if ((bool)uVar2) {
        if (local_28 == 0x31305641) {
          mkvmuxer::Track::set_codec_id
                    ((Track *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     (char *)CONCAT17(in_stack_fffffffffffffe4f,
                                      CONCAT16(uVar2,in_stack_fffffffffffffe48)));
          if ((1 < *local_30) || (1 < local_30[1])) {
            dVar8 = (double)(uint)(*(int *)(local_20 + 0xc) * *local_30) / (double)local_30[1] + 0.5
            ;
            uVar6 = (ulong)dVar8;
            mkvmuxer::VideoTrack::set_display_width
                      (local_100,uVar6 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f
                      );
            mkvmuxer::VideoTrack::set_display_height(local_100,(ulong)*(uint *)(local_20 + 0x10));
          }
          if (in_stack_00000008 == 0) {
LAB_00133878:
            if (*local_10 != 0) {
              mkvmuxer::Track::set_uid(&local_100->super_Track,0xdeadbeef);
            }
            pMVar7 = std::unique_ptr<mkvmuxer::MkvWriter,_std::default_delete<mkvmuxer::MkvWriter>_>
                     ::release((unique_ptr<mkvmuxer::MkvWriter,_std::default_delete<mkvmuxer::MkvWriter>_>
                                *)0x1338a8);
            *(pointer *)(local_10 + 6) = pMVar7;
            pSVar4 = std::unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>::
                     release((unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>
                              *)0x1338c4);
            *(pointer *)(local_10 + 8) = pSVar4;
            local_4 = 0;
          }
          else {
            std::unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>::operator->
                      ((unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> *)
                       0x1337b3);
            in_stack_fffffffffffffe40 = (Segment *)mkvmuxer::Segment::AddTag((Segment *)0x1337bb);
            if (in_stack_fffffffffffffe40 == (Segment *)0x0) {
              fprintf(_stderr,"webmenc> Unable to allocate memory for encoder settings tag.\n");
              local_4 = -1;
            }
            else {
              local_69 = mkvmuxer::Tag::add_simple_tag
                                   ((Tag *)this,
                                    (char *)CONCAT44(in_stack_fffffffffffffe54,
                                                     in_stack_fffffffffffffe50),
                                    (char *)CONCAT17(in_stack_fffffffffffffe4f,
                                                     CONCAT16(uVar2,in_stack_fffffffffffffe48)));
              if ((bool)local_69) goto LAB_00133878;
              fprintf(_stderr,"webmenc> Unable to allocate memory for encoder settings tag.\n");
              local_4 = -1;
            }
          }
        }
        else {
          fprintf(_stderr,"webmenc> Unsupported codec (unknown 4 CC).\n");
          local_4 = -1;
        }
      }
      else {
        fprintf(_stderr,"webmenc> Unable to set stereo mode.\n");
        local_4 = -1;
      }
    }
  }
  local_68 = 1;
  std::__cxx11::string::~string((string *)(local_a1 + 1));
LAB_00133907:
  std::unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_>::~unique_ptr
            ((unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> *)
             in_stack_fffffffffffffe40);
  std::unique_ptr<mkvmuxer::MkvWriter,_std::default_delete<mkvmuxer::MkvWriter>_>::~unique_ptr
            ((unique_ptr<mkvmuxer::MkvWriter,_std::default_delete<mkvmuxer::MkvWriter>_> *)
             in_stack_fffffffffffffe40);
  return local_4;
}

Assistant:

int write_webm_file_header(struct WebmOutputContext *webm_ctx,
                           aom_codec_ctx_t *encoder_ctx,
                           const aom_codec_enc_cfg_t *cfg,
                           stereo_format_t stereo_fmt, unsigned int fourcc,
                           const struct AvxRational *par,
                           const char *encoder_settings) {
  std::unique_ptr<mkvmuxer::MkvWriter> writer(
      new (std::nothrow) mkvmuxer::MkvWriter(webm_ctx->stream));
  std::unique_ptr<mkvmuxer::Segment> segment(new (std::nothrow)
                                                 mkvmuxer::Segment());
  if (writer == nullptr || segment == nullptr) {
    fprintf(stderr, "webmenc> mkvmuxer objects alloc failed, out of memory?\n");
    return -1;
  }

  bool ok = segment->Init(writer.get());
  if (!ok) {
    fprintf(stderr, "webmenc> mkvmuxer Init failed.\n");
    return -1;
  }

  segment->set_mode(mkvmuxer::Segment::kFile);
  segment->OutputCues(true);

  mkvmuxer::SegmentInfo *const info = segment->GetSegmentInfo();
  if (!info) {
    fprintf(stderr, "webmenc> Cannot retrieve Segment Info.\n");
    return -1;
  }

  const uint64_t kTimecodeScale = 1000000;
  info->set_timecode_scale(kTimecodeScale);
  std::string version = "aomenc";
  if (!webm_ctx->debug) {
    version.append(std::string(" ") + aom_codec_version_str());
  }
  info->set_writing_app(version.c_str());

  const uint64_t video_track_id =
      segment->AddVideoTrack(static_cast<int>(cfg->g_w),
                             static_cast<int>(cfg->g_h), kVideoTrackNumber);
  mkvmuxer::VideoTrack *const video_track = static_cast<mkvmuxer::VideoTrack *>(
      segment->GetTrackByNumber(video_track_id));

  if (!video_track) {
    fprintf(stderr, "webmenc> Video track creation failed.\n");
    return -1;
  }

  ok = false;
  aom_fixed_buf_t *obu_sequence_header =
      aom_codec_get_global_headers(encoder_ctx);
  if (obu_sequence_header) {
    Av1Config av1_config;
    if (get_av1config_from_obu(
            reinterpret_cast<const uint8_t *>(obu_sequence_header->buf),
            obu_sequence_header->sz, false, &av1_config) == 0) {
      uint8_t av1_config_buffer[4] = { 0 };
      size_t bytes_written = 0;
      if (write_av1config(&av1_config, sizeof(av1_config_buffer),
                          &bytes_written, av1_config_buffer) == 0) {
        ok = video_track->SetCodecPrivate(av1_config_buffer,
                                          sizeof(av1_config_buffer));
      }
    }
    free(obu_sequence_header->buf);
    free(obu_sequence_header);
  }
  if (!ok) {
    fprintf(stderr, "webmenc> Unable to set AV1 config.\n");
    return -1;
  }

  ok = video_track->SetStereoMode(stereo_fmt);
  if (!ok) {
    fprintf(stderr, "webmenc> Unable to set stereo mode.\n");
    return -1;
  }

  if (fourcc != AV1_FOURCC) {
    fprintf(stderr, "webmenc> Unsupported codec (unknown 4 CC).\n");
    return -1;
  }
  video_track->set_codec_id("V_AV1");

  if (par->numerator > 1 || par->denominator > 1) {
    // TODO(fgalligan): Add support of DisplayUnit, Display Aspect Ratio type
    // to WebM format.
    const uint64_t display_width = static_cast<uint64_t>(
        ((cfg->g_w * par->numerator * 1.0) / par->denominator) + .5);
    video_track->set_display_width(display_width);
    video_track->set_display_height(cfg->g_h);
  }

  if (encoder_settings != nullptr) {
    mkvmuxer::Tag *tag = segment->AddTag();
    if (tag == nullptr) {
      fprintf(stderr,
              "webmenc> Unable to allocate memory for encoder settings tag.\n");
      return -1;
    }
    ok = tag->add_simple_tag("ENCODER_SETTINGS", encoder_settings);
    if (!ok) {
      fprintf(stderr,
              "webmenc> Unable to allocate memory for encoder settings tag.\n");
      return -1;
    }
  }

  if (webm_ctx->debug) {
    video_track->set_uid(kDebugTrackUid);
  }

  webm_ctx->writer = writer.release();
  webm_ctx->segment = segment.release();
  return 0;
}